

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool __thiscall
llvm::cl::parser<bool>::parse
          (parser<bool> *this,Option *O,StringRef ArgName,StringRef Arg,bool *Value)

{
  raw_ostream *Errs;
  StringRef local_78;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  local_78.Length = Arg.Length;
  local_78.Data = Arg.Data;
  switch(local_78.Length) {
  case 0:
    goto switchD_001837d5_caseD_0;
  case 1:
switchD_001837d5_caseD_1:
    if ((char)*(int *)local_78.Data == '1') {
switchD_001837d5_caseD_0:
      *Value = true;
      return false;
    }
    if (local_78.Length != 1) {
      if (local_78.Length != 5) goto switchD_001837d5_caseD_2;
      goto switchD_001837d5_caseD_5;
    }
    goto LAB_001838a6;
  default:
    goto switchD_001837d5_caseD_2;
  case 4:
    break;
  case 5:
    goto switchD_001837d5_caseD_5;
  }
  if (*(int *)local_78.Data == 0x65757274) goto switchD_001837d5_caseD_0;
  if (local_78.Length == 1) goto switchD_001837d5_caseD_1;
  if (local_78.Length != 5) {
    if ((local_78.Length != 4) ||
       ((*(int *)local_78.Data != 0x45555254 && (*(int *)local_78.Data != 0x65757254))))
    goto switchD_001837d5_caseD_2;
    goto switchD_001837d5_caseD_0;
  }
switchD_001837d5_caseD_5:
  if ((char)*(int *)((long)local_78.Data + 4) != 'e' || *(int *)local_78.Data != 0x736c6166) {
    if (local_78.Length == 1) {
LAB_001838a6:
      if ((char)*(int *)local_78.Data != '0') {
switchD_001837d5_caseD_2:
        Twine::Twine(&local_50,"\'",&local_78);
        Twine::Twine(&local_68,"\' is invalid value for boolean argument! Try 0 or 1");
        operator+(&local_38,&local_50,&local_68);
        Errs = errs();
        Option::error(O,&local_38,(StringRef)ZEXT816(0),Errs);
        return true;
      }
    }
    else if ((local_78.Length != 5) ||
            (((char)*(int *)((long)local_78.Data + 4) != 'E' || *(int *)local_78.Data != 0x534c4146
             && ((char)*(int *)((long)local_78.Data + 4) != 'e' ||
                 *(int *)local_78.Data != 0x736c6146)))) goto switchD_001837d5_caseD_2;
  }
  *Value = false;
  return false;
}

Assistant:

bool parser<bool>::parse(Option &O, StringRef ArgName, StringRef Arg,
                         bool &Value) {
  if (Arg == "" || Arg == "true" || Arg == "TRUE" || Arg == "True" ||
      Arg == "1") {
    Value = true;
    return false;
  }

  if (Arg == "false" || Arg == "FALSE" || Arg == "False" || Arg == "0") {
    Value = false;
    return false;
  }
  return O.error("'" + Arg +
                 "' is invalid value for boolean argument! Try 0 or 1");
}